

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O2

void RelPath(tchar_t *Rel,int RelLen,tchar_t *Path,tchar_t *Base)

{
  ulong uVar1;
  int iVar2;
  tchar_t *__s;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  ulong n;
  bool_t HasHost;
  
  __s = GetProtocol(Base,(tchar_t *)0x0,0,&HasHost);
  if (__s != Base) {
    pcVar5 = __s;
    if (HasHost != 0) {
      pcVar3 = strchr(__s,0x5c);
      pcVar4 = strchr(__s,0x2f);
      if (pcVar3 == (char *)0x0) {
        pcVar5 = pcVar4;
        if (pcVar4 == (char *)0x0) {
          sVar6 = strlen(__s);
          pcVar5 = __s + sVar6;
        }
      }
      else {
        pcVar5 = pcVar3;
        if (pcVar4 < pcVar3) {
          pcVar5 = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          pcVar5 = pcVar3;
        }
      }
    }
    n = (long)pcVar5 - (long)Base;
    if (((n != 0) && (sVar6 = strlen(Path), n < sVar6)) && ((Path[n] == '\\' || (Path[n] == '/'))))
    {
      iVar2 = tcsnicmp(Path,Base,n);
      uVar1 = 0;
      if (iVar2 == 0) {
        Path = Path + n;
        uVar1 = n;
      }
      Base = Base + uVar1;
    }
  }
  sVar6 = strlen(Base);
  if (((sVar6 != 0) && (sVar7 = strlen(Path), sVar6 < sVar7)) &&
     (((Path[sVar6] == '\\' || (Path[sVar6] == '/')) &&
      (iVar2 = tcsnicmp(Path,Base,sVar6), iVar2 == 0)))) {
    Path = Path + sVar6 + 1;
  }
  tcscpy_s(Rel,(long)RelLen,Path);
  return;
}

Assistant:

void RelPath(tchar_t* Rel, int RelLen, const tchar_t* Path, const tchar_t* Base)
{
    size_t n;
    bool_t HasHost;
    const tchar_t* p = GetProtocol(Base,NULL,0,&HasHost);
    if (p != Base)
    {
        if (HasHost)
        {
            // include host name too
            tchar_t *a,*b;
            a = tcschr(p,'\\');
            b = tcschr(p,'/');
            if (!a || (b && b<a))
                a=b;
            if (a)
                p=a;
            else
                p+=tcslen(p);
        }

        // check if mime and host is the same
        n = p-Base;
        if (n>0 && n<tcslen(Path) && (Path[n]=='\\' || Path[n]=='/') && tcsnicmp(Path,Base,n)==0)
        {
            Base += n;
            Path += n;
        }
    }

    n = tcslen(Base);
    if (n>0 && n<tcslen(Path) && (Path[n]=='\\' || Path[n]=='/') && tcsnicmp(Path,Base,n)==0)
        Path += n+1;

    tcscpy_s(Rel,RelLen,Path);
}